

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O3

bool __thiscall
SslTcpSocketImpl::Connect(SslTcpSocketImpl *this,char *szIpToWhere,uint16_t sPort,int AddrHint)

{
  bool bVar1;
  SslConnection *pSVar2;
  pointer __p;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pSVar2 = (SslConnection *)operator_new(0x70);
  OpenSSLWrapper::SslConnection::SslConnection(pSVar2,&(this->m_pClientCtx).super_SslContext);
  local_70._M_unused._M_object = (void *)0x0;
  std::
  __uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  ::reset((__uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           *)&this->m_pSslCon,pSVar2);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)&local_70);
  pSVar2 = (this->m_pSslCon)._M_t.
           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ._M_t.
           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
  local_70._8_8_ = 0;
  local_70._M_unused._M_object = operator_new(0x18);
  *(undefined8 *)local_70._M_unused._0_8_ = 0x11;
  *(undefined8 *)((long)local_70._M_unused._0_8_ + 8) = 0;
  *(SslTcpSocketImpl **)((long)local_70._M_unused._0_8_ + 0x10) = this;
  local_58 = std::
             _Function_handler<void_(),_std::_Bind<void_(BaseSocketImpl::*(SslTcpSocketImpl_*))()>_>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(),_std::_Bind<void_(BaseSocketImpl::*(SslTcpSocketImpl_*))()>_>
             ::_M_manager;
  OpenSSLWrapper::SslConnection::SetErrorCb(pSVar2,(function<void_()> *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  OpenSSLWrapper::SslConnection::SetUserData
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,0,
             fnForwarder_abi_cxx11_);
  OpenSSLWrapper::SslConnection::SetUserData
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,1,this);
  OpenSSLWrapper::SslConnection::SetSniName
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,szIpToWhere
            );
  if ((this->m_vProtoList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_vProtoList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    OpenSSLWrapper::SslConnection::SetAlpnProtokollNames
              ((this->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
               &this->m_vProtoList);
  }
  if ((this->m_strTrustRootCert)._M_string_length != 0) {
    OpenSSLWrapper::SslConnection::SetTrustedRootCertificates
              ((this->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
               (this->m_strTrustRootCert)._M_dataplus._M_p);
  }
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x18);
  *(code **)local_50._M_unused._0_8_ = ConEstablished;
  *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
  *(SslTcpSocketImpl **)((long)local_50._M_unused._0_8_ + 0x10) = this;
  local_38 = std::
             _Function_handler<void_(TcpSocketImpl_*),_std::_Bind<void_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>))(const_TcpSocketImpl_*)>_>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(TcpSocketImpl_*),_std::_Bind<void_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>))(const_TcpSocketImpl_*)>_>
             ::_M_manager;
  TcpSocketImpl::BindFuncConEstablished
            (&this->super_TcpSocketImpl,(function<void_(TcpSocketImpl_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  bVar1 = TcpSocketImpl::Connect(&this->super_TcpSocketImpl,szIpToWhere,sPort,AddrHint);
  return bVar1;
}

Assistant:

bool SslTcpSocketImpl::Connect(const char* const szIpToWhere, const uint16_t sPort, const int AddrHint/* = AF_UNSPEC*/)
{
    m_pSslCon = make_unique<SslConnection>(m_pClientCtx);
    m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));
    m_pSslCon->SetUserData(0, reinterpret_cast<void*>(&SslTcpSocketImpl::fnForwarder));
    m_pSslCon->SetUserData(1, this);

    m_pSslCon->SetSniName(szIpToWhere);

    if (m_vProtoList.size() > 0)
        m_pSslCon->SetAlpnProtokollNames(m_vProtoList);
    if (m_strTrustRootCert.size() > 0)
        m_pSslCon->SetTrustedRootCertificates(m_strTrustRootCert.c_str());

    TcpSocketImpl::BindFuncConEstablished(bind(&SslTcpSocketImpl::ConEstablished, this, _1));
    return TcpSocketImpl::Connect(szIpToWhere, sPort, AddrHint);
}